

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assembly_generator_x86.cpp
# Opt level: O1

void __thiscall
randomx::AssemblyGeneratorX86::h_IXOR_M(AssemblyGeneratorX86 *this,Instruction *instr,int i)

{
  byte bVar1;
  size_t sVar2;
  ostream *poVar3;
  long lVar4;
  undefined1 *this_00;
  char *pcVar5;
  
  bVar1 = instr->dst;
  this->registerUsage[bVar1] = i;
  if (instr->src == bVar1) {
    this_00 = &this->field_0x10;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"\txor ",5);
    pcVar5 = *(char **)(regR + (ulong)instr->dst * 8);
    sVar2 = strlen(pcVar5);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,pcVar5,sVar2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", qword ptr [",0xd);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"rsi",3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"+",1);
    poVar3 = (ostream *)std::ostream::operator<<(this_00,instr->imm32 & 0x1fff8);
    pcVar5 = "]";
    lVar4 = 1;
  }
  else {
    genAddressReg(this,instr,"eax");
    poVar3 = (ostream *)&this->field_0x10;
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\txor ",5);
    pcVar5 = *(char **)(regR + (ulong)instr->dst * 8);
    sVar2 = strlen(pcVar5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,pcVar5,sVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", qword ptr [",0xd);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"rsi",3);
    pcVar5 = "+rax]";
    lVar4 = 5;
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,pcVar5,lVar4);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  return;
}

Assistant:

void AssemblyGeneratorX86::h_IXOR_M(Instruction& instr, int i) {
		registerUsage[instr.dst] = i;
		if (instr.src != instr.dst) {
			genAddressReg(instr);
			asmCode << "\txor " << regR[instr.dst] << ", qword ptr [" << regScratchpadAddr << "+rax]" << std::endl;
		}
		else {
			asmCode << "\txor " << regR[instr.dst] << ", qword ptr [" << regScratchpadAddr << "+" << genAddressImm(instr) << "]" << std::endl;
		}
		traceint(instr);
	}